

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

Function * __thiscall wasm::Debug::FuncAddrMap::getStart(FuncAddrMap *this,BinaryLocation addr)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Function_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Function_*>,_false> local_28;
  const_iterator iter;
  BinaryLocation addr_local;
  FuncAddrMap *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Function_*>,_false>._M_cur.
  _4_4_ = addr;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
       ::find(&this->startMap,
              (key_type *)
              ((long)&iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Function_*>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>_>
       ::end(&this->startMap);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_wasm::Function_*>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_wasm::Function_*>,_false,_false>
                         *)&local_28);
    this_local = (FuncAddrMap *)pvVar2->second;
  }
  else {
    this_local = (FuncAddrMap *)0x0;
  }
  return (Function *)this_local;
}

Assistant:

Function* getStart(BinaryLocation addr) const {
    auto iter = startMap.find(addr);
    if (iter != startMap.end()) {
      return iter->second;
    }
    return nullptr;
  }